

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O1

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>::ComputeShape
          (TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra> *this,TPZVec<double> *qsi,
          TPZMaterialData *data)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  TPZShapeData *shapedata;
  ulong uVar5;
  long lVar6;
  TPZFMatrix<double> curlHCurl;
  TPZFMatrix<double> phiHCurl;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  bVar1 = data->fNeedsSol;
  data->fNeedsSol = true;
  iVar2 = (**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapeTetra>).
                                 super_TPZIntelGen<pzshape::TPZShapeTetra>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))();
  lVar6 = (long)iVar2;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar5 = 0xffffffffffffffff;
    if ((ulong)(lVar6 * 3) < 0x2000000000000000) {
      uVar5 = lVar6 * 0x18;
    }
    local_c0.fElem = (double *)operator_new__(uVar5);
    if (0 < iVar2) {
      memset(local_c0.fElem,0,lVar6 * 0x18);
    }
  }
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar5 = 0xffffffffffffffff;
    if ((ulong)(lVar6 * 3) < 0x2000000000000000) {
      uVar5 = lVar6 * 0x18;
    }
    local_150.fElem = (double *)operator_new__(uVar5);
    if (0 < iVar2) {
      memset(local_150.fElem,0,lVar6 * 0x18);
    }
  }
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape
            (qsi,&data->super_TPZShapeData,&local_c0,&local_150);
  TPZCompElHCurl<pzshape::TPZShapeTetra>::TransformCurl<3>
            (&local_150,data->detjac,&(data->jacobian).super_TPZFMatrix<double>,
             &(data->curlphi).super_TPZFMatrix<double>);
  data->fNeedsSol = bVar1;
  if (iVar2 != (int)(data->curlphi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElKernelHDiv3D.cpp"
               ,0x86);
  }
  TPZFMatrix<double>::operator=
            (&(data->fDeformedDirections).super_TPZFMatrix<double>,
             &(data->curlphi).super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=(&(data->phi).super_TPZFMatrix<double>,1.0);
  TPZFMatrix<double>::operator=(&(data->dphix).super_TPZFMatrix<double>,1.0);
  if (0 < iVar2) {
    plVar3 = &((data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore)->second;
    lVar4 = 0;
    do {
      ((pair<int,_long> *)(plVar3 + -1))->first = (int)lVar4;
      *plVar3 = lVar4;
      lVar4 = lVar4 + 1;
      plVar3 = plVar3 + 2;
    } while (lVar6 != lVar4);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data){
                                                
    bool needsol = data.fNeedsSol;
    data.fNeedsSol = true;

    auto nshape = this->NShapeF();
    TPZFMatrix<REAL> phiHCurl(3,nshape,0.);
    TPZFMatrix<REAL> curlHCurl(3,nshape,0.);

    TPZShapeHCurlNoGrads<TSHAPE>::Shape(qsi,data,phiHCurl,curlHCurl);
    TPZCompElHCurl<TSHAPE>::TransformCurl(curlHCurl, data.detjac, data.jacobian, data.curlphi);    
    
    data.fNeedsSol = needsol;
    if (TSHAPE::Dimension == 3){        
        TPZShapeData &shapedata = data;
        int size = data.curlphi.Cols();
        if (size != nshape) DebugStop();
        int ncorner = TSHAPE::NCornerNodes;
        data.fDeformedDirections = data.curlphi;
        data.phi = 1.;
        data.dphix = 1.;
        
    } else if (TSHAPE::Dimension == 2) {
        if (data.phi.Rows()>1){
            for (int i = 0; i < data.phi.Rows(); i++){
                data.phi(i,0) = data.curlphi(0,i);
            }
        }
    } else {
        DebugStop();
    }

    for (int j = 0; j < nshape; j++){
        data.fVecShapeIndex[j].first = j;
        data.fVecShapeIndex[j].second = j;
    }

}